

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O1

void mg_send_file_internal
               (mg_connection *c,char *file_name,file_stat_t *st,int exists,char *extra_headers)

{
  byte bVar1;
  uint uVar2;
  int iVar3;
  void *pvVar4;
  undefined8 uVar5;
  bool bVar6;
  int iVar7;
  __pid_t _Var8;
  size_t sVar9;
  char *pcVar10;
  __int32_t **pp_Var11;
  char *pcVar12;
  FILE *__stream;
  byte *pbVar13;
  ns_connection *pnVar14;
  int *piVar15;
  long lVar16;
  char *pcVar17;
  ulong uVar18;
  connection *pcVar19;
  int i;
  size_t sVar20;
  long lVar21;
  bool bVar22;
  int local_648c;
  int day;
  int hour;
  connection *local_6480;
  char *local_6478;
  char *local_6470;
  file_stat_t *local_6468;
  int minute;
  int local_645c;
  char *local_6458;
  mg_connection *local_6450;
  int second;
  file_stat_t st_1;
  undefined8 local_4240 [64];
  undefined8 local_4040;
  char path [8192];
  char dir [8192];
  
  uVar2 = st->st_mode;
  pcVar19 = (connection *)&c[-1].callback_param;
  local_6478 = *(char **)(c[1].request_method + 0x58);
  lVar21 = *(long *)(c[1].request_method + 0x70);
  local_6468 = st;
  mg_snprintf(path,0x2000,"%s",file_name);
  if ((exists != 0) && (iVar7 = must_hide_file(pcVar19,path), iVar7 == 0)) {
    if ((uVar2 & 0xf000) == 0x4000) {
      pcVar10 = c->uri;
      sVar9 = strlen(pcVar10);
      if (pcVar10[sVar9 - 1] != '/') {
        c->status_code = 0x12d;
        mg_printf(c,"HTTP/1.1 301 Moved Permanently\r\nLocation: %s/\r\n\r\n",pcVar10);
        goto LAB_001084e8;
      }
      pcVar10 = *(char **)(c[1].request_method + 0xa0);
      local_6450 = c;
      sVar9 = strlen(path);
      if (sVar9 != 0) {
        do {
          if (path[sVar9 - 1] != '/') goto LAB_001080ce;
          sVar9 = sVar9 - 1;
        } while (sVar9 != 0);
        sVar9 = 0;
      }
LAB_001080ce:
      local_6470 = path + sVar9;
      *local_6470 = '/';
      pcVar10 = next_option(pcVar10,(vec *)dir,(vec *)0x0);
      bVar6 = true;
      bVar22 = pcVar10 == (char *)0x0;
      extra_headers = extra_headers;
      if (!bVar22) {
        pcVar17 = local_6470 + 1;
        bVar22 = false;
        local_6480 = pcVar19;
        local_6458 = extra_headers;
        do {
          sVar20 = (size_t)(int)dir._8_4_;
          if ((int)dir._8_4_ <= 0x1ffe - (int)sVar9) {
            strncpy(pcVar17,(char *)dir._0_8_,sVar20);
            pcVar17[sVar20] = '\0';
            iVar7 = stat64(path,(stat64 *)&st_1);
            if (iVar7 == 0) {
              memcpy(local_6468,&st_1,0x90);
              bVar6 = false;
              extra_headers = local_6458;
              pcVar19 = local_6480;
              goto LAB_001081db;
            }
          }
          pcVar10 = next_option(pcVar10,(vec *)dir,(vec *)0x0);
          bVar22 = pcVar10 == (char *)0x0;
        } while (!bVar22);
        bVar6 = true;
        extra_headers = local_6458;
        pcVar19 = local_6480;
      }
LAB_001081db:
      if (bVar22) {
        *local_6470 = '\0';
      }
      c = local_6450;
      if (bVar6) {
        pp_Var11 = __ctype_tolower_loc();
        lVar16 = 0;
        do {
          bVar1 = *(byte *)(lVar21 + lVar16);
          iVar7 = (*pp_Var11)[bVar1];
          iVar3 = (*pp_Var11)[(byte)"yes"[lVar16]];
          if (bVar1 == 0) break;
          lVar16 = lVar16 + 1;
        } while (iVar7 == iVar3);
        if (iVar7 == iVar3) {
          send_directory_listing(pcVar19,path);
          return;
        }
        iVar7 = 0x193;
        goto LAB_00108055;
      }
    }
    pcVar10 = local_6478;
    sVar9 = strlen(local_6478);
    iVar7 = mg_match_prefix(pcVar10,(int)sVar9,path);
    if (0 < iVar7) {
      pcVar10 = c[1].request_method;
      local_4040._0_4_ = 0;
      local_4040._4_4_ = 0;
      st_1.st_dev = (__dev_t)c;
      pcVar12 = getenv("SERVER_NAME");
      pcVar17 = c->local_ip;
      if (pcVar12 != (char *)0x0) {
        pcVar17 = pcVar12;
      }
      addenv((cgi_env_block *)&st_1,"SERVER_NAME=%s",pcVar17);
      addenv((cgi_env_block *)&st_1,"SERVER_ROOT=%s",*(undefined8 *)(pcVar10 + 0x68));
      addenv((cgi_env_block *)&st_1,"DOCUMENT_ROOT=%s",*(undefined8 *)(pcVar10 + 0x68));
      addenv((cgi_env_block *)&st_1,"SERVER_SOFTWARE=%s/%s","Mongoose","5.4");
      addenv((cgi_env_block *)&st_1,"%s","GATEWAY_INTERFACE=CGI/1.1");
      addenv((cgi_env_block *)&st_1,"%s","SERVER_PROTOCOL=HTTP/1.1");
      addenv((cgi_env_block *)&st_1,"%s","REDIRECT_STATUS=200");
      addenv((cgi_env_block *)&st_1,"REQUEST_METHOD=%s",c->request_method);
      addenv((cgi_env_block *)&st_1,"REMOTE_ADDR=%s",c->remote_ip);
      addenv((cgi_env_block *)&st_1,"REMOTE_PORT=%d",(ulong)c->remote_port);
      pcVar10 = c->query_string;
      pcVar17 = "?";
      if (pcVar10 == (char *)0x0) {
        pcVar17 = "";
      }
      local_6478 = "";
      if (pcVar10 == (char *)0x0) {
        pcVar10 = "";
      }
      addenv((cgi_env_block *)&st_1,"REQUEST_URI=%s%s%s",c->uri,pcVar17,pcVar10);
      pcVar10 = c[1].query_string;
      if (pcVar10 == (char *)0x0) {
        pcVar17 = strrchr(path,0x2f);
        pcVar10 = c->uri;
        pcVar12 = strrchr(pcVar10,0x2f);
        uVar18 = (ulong)(uint)((int)pcVar12 - (int)pcVar10);
        if (pcVar12 == (char *)0x0) {
          uVar18 = 0;
        }
        if (pcVar17 == (char *)0x0) {
          pcVar17 = path;
        }
        addenv((cgi_env_block *)&st_1,"SCRIPT_NAME=%.*s%s",uVar18,pcVar10,pcVar17);
      }
      else {
        pcVar17 = c->uri;
        sVar9 = strlen(pcVar17);
        sVar20 = strlen(pcVar10);
        addenv((cgi_env_block *)&st_1,"SCRIPT_NAME=%.*s",(ulong)(uint)((int)sVar9 - (int)sVar20),
               pcVar17);
        addenv((cgi_env_block *)&st_1,"PATH_INFO=%s",c[1].query_string);
      }
      addenv((cgi_env_block *)&st_1,"SCRIPT_FILENAME=%s",path);
      addenv((cgi_env_block *)&st_1,"PATH_TRANSLATED=%s",path);
      pcVar10 = "on";
      if (*(long *)((long)c[-1].callback_param + 0x68) == 0) {
        pcVar10 = "off";
      }
      addenv((cgi_env_block *)&st_1,"HTTPS=%s",pcVar10);
      pcVar10 = mg_get_header(c,"Content-Type");
      if (pcVar10 != (char *)0x0) {
        addenv((cgi_env_block *)&st_1,"CONTENT_TYPE=%s",pcVar10);
      }
      if (c->query_string != (char *)0x0) {
        addenv((cgi_env_block *)&st_1,"QUERY_STRING=%s");
      }
      local_6480 = pcVar19;
      pcVar10 = mg_get_header(c,"Content-Length");
      if (pcVar10 != (char *)0x0) {
        addenv((cgi_env_block *)&st_1,"CONTENT_LENGTH=%s",pcVar10);
      }
      addenv2((cgi_env_block *)&st_1,"PATH");
      addenv2((cgi_env_block *)&st_1,"TMP");
      addenv2((cgi_env_block *)&st_1,"TEMP");
      addenv2((cgi_env_block *)&st_1,"TMPDIR");
      addenv2((cgi_env_block *)&st_1,"PERLLIB");
      addenv2((cgi_env_block *)&st_1,"MONGOOSE_CGI");
      addenv2((cgi_env_block *)&st_1,"LD_LIBRARY_PATH");
      if (c->num_headers < 1) {
LAB_00108719:
        pcVar19 = local_6480;
        lVar21 = (long)local_4040._4_4_;
        local_4040._4_4_ = local_4040._4_4_ + 1;
        local_4240[lVar21] = 0;
        lVar21 = (long)(int)local_4040;
        local_4040._0_4_ = (int)local_4040 + 1;
        *(undefined1 *)((long)st_1.__glibc_reserved + lVar21 + -0x70) = 0;
        if (0x3f < local_4040._4_4_) {
          __assert_fail("blk->nvars < (int) ARRAY_SIZE(blk->vars)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/ProjetoHotSpot[P]UaiFai/lib/mongoose.c"
                        ,0x889,
                        "void prepare_cgi_environment(struct connection *, const char *, struct cgi_env_block *)"
                       );
        }
        if ((int)local_4040 < 1) {
          __assert_fail("blk->len > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/ProjetoHotSpot[P]UaiFai/lib/mongoose.c"
                        ,0x88a,
                        "void prepare_cgi_environment(struct connection *, const char *, struct cgi_env_block *)"
                       );
        }
        if (0x1fff < (int)local_4040) {
          __assert_fail("blk->len < (int) sizeof(blk->buf)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/ProjetoHotSpot[P]UaiFai/lib/mongoose.c"
                        ,0x88b,
                        "void prepare_cgi_environment(struct connection *, const char *, struct cgi_env_block *)"
                       );
        }
        pcVar10 = strrchr(path,0x2f);
        if (pcVar10 == (char *)0x0) {
          mg_snprintf(dir,0x2000,"%s",".");
        }
        else {
          mg_snprintf(dir,0x2000,"%.*s",(ulong)(uint)((int)pcVar10 - (int)path));
        }
        do {
          ns_socketpair2(&minute,1);
        } while (minute == -1);
        pcVar10 = *(char **)(c[1].request_method + 0x50);
        _Var8 = fork();
        if (_Var8 != 0) {
          *(undefined4 *)&c[1].http_version = 2;
          pnVar14 = ns_add_sock((ns_mgr *)c[1].request_method,minute,mg_ev_handler,pcVar19);
          c[1].uri = (char *)pnVar14;
          pbVar13 = (byte *)((long)&pnVar14->flags + 2);
          *pbVar13 = *pbVar13 | 0x40;
          ns_out((ns_connection *)c[-1].callback_param,"HTTP/1.1 200 OK\r\n",0x11);
          c->status_code = 200;
          pvVar4 = c[-1].callback_param;
          *(uint *)((long)pvVar4 + 0x98) = *(uint *)((long)pvVar4 + 0x98) | 2;
          pcVar10 = c[1].uri;
          uVar5 = *(undefined8 *)((long)pvVar4 + 0x40);
          *(undefined8 *)(pcVar10 + 0x50) = *(undefined8 *)((long)pvVar4 + 0x38);
          *(undefined8 *)(pcVar10 + 0x58) = uVar5;
          *(undefined8 *)(pcVar10 + 0x60) = *(undefined8 *)((long)pvVar4 + 0x48);
          pvVar4 = c[-1].callback_param;
          *(undefined8 *)((long)pvVar4 + 0x38) = 0;
          *(undefined8 *)((long)pvVar4 + 0x40) = 0;
          *(undefined8 *)((long)pvVar4 + 0x48) = 0;
          iobuf_resize((iobuf *)((long)pvVar4 + 0x38),0);
          close(local_645c);
          return;
        }
        chdir(dir);
        dup2(local_645c,0);
        dup2(local_645c,1);
        close(local_645c);
        __sysv_signal(0x11,(__sighandler_t)0x0);
        if (pcVar10 == (char *)0x0) {
          execle(path,path,0,local_4240);
          pcVar10 = "";
        }
        else {
          execle(pcVar10,pcVar10,path,0,local_4240);
          local_6478 = " ";
        }
        piVar15 = __errno_location();
        pcVar17 = strerror(*piVar15);
        snprintf((char *)&second,500,"Status: 500\r\n\r\n500 Server Error: %s%s%s: %s",pcVar10,
                 local_6478,path,pcVar17);
        sVar9 = strlen((char *)&second);
        send(1,&second,sVar9,0);
        exit(1);
      }
      lVar21 = 0;
LAB_001086be:
      pbVar13 = (byte *)addenv((cgi_env_block *)&st_1,"HTTP_%s=%s",c->http_headers[lVar21].name,
                               c->http_headers[lVar21].value);
      do {
        bVar1 = *pbVar13;
        if (bVar1 == 0x2d) {
          *pbVar13 = 0x5f;
        }
        else if ((bVar1 == 0) || (bVar1 == 0x3d)) goto LAB_0010870a;
        pp_Var11 = __ctype_toupper_loc();
        *pbVar13 = *(byte *)(*pp_Var11 + *pbVar13);
        pbVar13 = pbVar13 + 1;
      } while( true );
    }
    pcVar10 = *(char **)(c[1].request_method + 0xb8);
    sVar9 = strlen(pcVar10);
    iVar7 = mg_match_prefix(pcVar10,(int)sVar9,path);
    if (0 < iVar7) {
      __stream = fopen64(path,"rb");
      if (__stream == (FILE *)0x0) {
        piVar15 = __errno_location();
        pcVar10 = strerror(*piVar15);
        send_http_error(pcVar19,500,"fopen(%s): %s",path,pcVar10);
        return;
      }
      iVar7 = fileno(__stream);
      fcntl64(iVar7,2,1);
      get_mime_type((mg_server *)c[1].request_method,path,(vec *)&st_1);
      c->status_code = 200;
      mg_printf(c,"HTTP/1.1 %d OK\r\nContent-Type: %.*s\r\nConnection: close\r\n\r\n",200,
                (ulong)(uint)st_1.st_ino,st_1.st_dev);
      send_ssi_file(c,path,(FILE *)__stream,0);
      fclose(__stream);
LAB_001084e8:
      close_local_endpoint(pcVar19);
      return;
    }
    pcVar10 = mg_get_header(c,"If-Modified-Since");
    pcVar17 = mg_get_header(c,"If-None-Match");
    mg_snprintf((char *)&st_1,0x40,"\"%lx.%ld\"",local_6468->st_mtime,local_6468->st_size);
    if (pcVar17 != (char *)0x0) {
      pp_Var11 = __ctype_tolower_loc();
      lVar21 = 0;
      do {
        bVar1 = *(byte *)((long)st_1.__glibc_reserved + lVar21 + -0x78);
        iVar7 = (*pp_Var11)[bVar1];
        iVar3 = (*pp_Var11)[(byte)pcVar17[lVar21]];
        if (bVar1 == 0) break;
        lVar21 = lVar21 + 1;
      } while (iVar7 == iVar3);
      if (iVar7 != iVar3) goto LAB_00108944;
LAB_00108b74:
      iVar7 = 0x130;
      goto LAB_00108055;
    }
LAB_00108944:
    if (pcVar10 != (char *)0x0) {
      local_6478 = (char *)local_6468->st_mtime;
      local_6480 = pcVar19;
      iVar7 = __isoc99_sscanf(pcVar10,"%d/%3s/%d %d:%d:%d",&day,dir,&local_648c,&hour,&minute,
                              &second);
      if (((iVar7 == 6) ||
          (iVar7 = __isoc99_sscanf(pcVar10,"%d %3s %d %d:%d:%d",&day,dir,&local_648c,&hour,&minute,
                                   &second), iVar7 == 6)) ||
         (iVar7 = __isoc99_sscanf(pcVar10,"%*3s, %d %3s %d %d:%d:%d",&day,dir,&local_648c,&hour,
                                  &minute,&second), iVar7 == 6)) {
        if (0x7b2 < local_648c) goto LAB_00108a1b;
LAB_00108b26:
        lVar21 = 0;
      }
      else {
        lVar21 = 0;
        iVar7 = __isoc99_sscanf(pcVar10,"%d-%3s-%d %d:%d:%d",&day,dir,&local_648c,&hour,&minute,
                                &second);
        if ((iVar7 == 6) && (0x7b2 < local_648c)) {
LAB_00108a1b:
          lVar21 = 0;
          piVar15 = &get_month_index_month_names_rel;
          do {
            iVar7 = strcmp(dir,(char *)((long)&get_month_index_month_names_rel + (long)*piVar15));
            if (iVar7 == 0) goto LAB_00108a56;
            lVar21 = lVar21 + 1;
            piVar15 = piVar15 + 1;
          } while (lVar21 != 0xc);
          lVar21 = 0xffffffff;
LAB_00108a56:
          if ((int)lVar21 == -1) goto LAB_00108b26;
          iVar7 = local_648c + 3;
          if (-1 < local_648c) {
            iVar7 = local_648c;
          }
          iVar3 = (int)((ulong)((long)local_648c * -0x51eb851f) >> 0x20);
          lVar21 = (long)(int)((local_648c * 0x16d + local_648c / 400 +
                                ((iVar3 >> 5) - (iVar3 >> 0x1f)) + (iVar7 >> 2) +
                                (uint)*(ushort *)
                                       (parse_date_string_days_before_month + (long)(int)lVar21 * 2)
                               + day) * 0x15180 + minute * 0x3c + hour * 0xe10 + second +
                              -0x79747c00);
          local_648c = local_648c + -0x7b2;
        }
      }
      pcVar19 = local_6480;
      if ((long)local_6478 <= lVar21) goto LAB_00108b74;
    }
    iVar7 = open64(path,0,0);
    *(int *)&c[1].uri = iVar7;
    if (iVar7 != -1) {
      open_file_endpoint(pcVar19,path,local_6468,extra_headers);
      return;
    }
  }
  iVar7 = 0x194;
LAB_00108055:
  send_http_error(pcVar19,iVar7,(char *)0x0);
  return;
LAB_0010870a:
  lVar21 = lVar21 + 1;
  if (c->num_headers <= lVar21) goto LAB_00108719;
  goto LAB_001086be;
}

Assistant:

void mg_send_file_internal(struct mg_connection *c, const char *file_name,
                           file_stat_t *st, int exists,
                           const char *extra_headers) {
  struct connection *conn = MG_CONN_2_CONN(c);
  char path[MAX_PATH_SIZE];
  const int is_directory = S_ISDIR(st->st_mode);
#ifndef MONGOOSE_NO_CGI
  const char *cgi_pat = conn->server->config_options[CGI_PATTERN];
#else
  const char *cgi_pat = DEFAULT_CGI_PATTERN;
#endif
#ifndef MONGOOSE_NO_DIRECTORY_LISTING
  const char *dir_lst = conn->server->config_options[ENABLE_DIRECTORY_LISTING];
#else
  const char *dir_lst = "yes";
#endif

  mg_snprintf(path, sizeof(path), "%s", file_name);

  if (!exists || must_hide_file(conn, path)) {
    send_http_error(conn, 404, NULL);
  } else if (is_directory &&
             conn->mg_conn.uri[strlen(conn->mg_conn.uri) - 1] != '/') {
    conn->mg_conn.status_code = 301;
    mg_printf(&conn->mg_conn, "HTTP/1.1 301 Moved Permanently\r\n"
              "Location: %s/\r\n\r\n", conn->mg_conn.uri);
    close_local_endpoint(conn);
  } else if (is_directory && !find_index_file(conn, path, sizeof(path), st)) {
    if (!mg_strcasecmp(dir_lst, "yes")) {
#ifndef MONGOOSE_NO_DIRECTORY_LISTING
      send_directory_listing(conn, path);
#else
      send_http_error(conn, 501, NULL);
#endif
    } else {
      send_http_error(conn, 403, NULL);
    }
  } else if (mg_match_prefix(cgi_pat, strlen(cgi_pat), path) > 0) {
#if !defined(MONGOOSE_NO_CGI)
    open_cgi_endpoint(conn, path);
#else
    send_http_error(conn, 501, NULL);
#endif // !MONGOOSE_NO_CGI
#ifndef MONGOOSE_NO_SSI
  } else if (mg_match_prefix(conn->server->config_options[SSI_PATTERN],
                             strlen(conn->server->config_options[SSI_PATTERN]),
                             path) > 0) {
    handle_ssi_request(conn, path);
#endif
  } else if (is_not_modified(conn, st)) {
    send_http_error(conn, 304, NULL);
  } else if ((conn->endpoint.fd = open(path, O_RDONLY | O_BINARY, 0)) != -1) {
    // O_BINARY is required for Windows, otherwise in default text mode
    // two bytes \r\n will be read as one.
    open_file_endpoint(conn, path, st, extra_headers);
  } else {
    send_http_error(conn, 404, NULL);
  }
}